

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::EncodeLiteralInplace(cmGlobalNinjaGenerator *this,string *lit)

{
  string *source;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_c5 [13];
  string local_b8;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  string *local_18;
  string *lit_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_18 = lit;
  lit_local = (string *)this;
  cmsys::SystemTools::ReplaceString(lit,"$","$$");
  cmsys::SystemTools::ReplaceString(local_18,"\n","$\n");
  uVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])();
  source = local_18;
  if ((uVar1 & 1) != 0) {
    cmAlphaNum::cmAlphaNum(&local_68,'$');
    iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x15])();
    cmAlphaNum::cmAlphaNum(&local_98,(char *)CONCAT44(extraout_var,iVar2));
    cmStrCat<>(&local_38,&local_68,&local_98);
    iVar2 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x15])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,(char *)CONCAT44(extraout_var_00,iVar2),local_c5);
    cmsys::SystemTools::ReplaceString(source,&local_38,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(local_c5);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::EncodeLiteralInplace(std::string& lit)
{
  cmSystemTools::ReplaceString(lit, "$", "$$");
  cmSystemTools::ReplaceString(lit, "\n", "$\n");
  if (this->IsMultiConfig()) {
    cmSystemTools::ReplaceString(lit, cmStrCat('$', this->GetCMakeCFGIntDir()),
                                 this->GetCMakeCFGIntDir());
  }
}